

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

uint8_t * WebPDecodeYUV(uint8_t *data,size_t data_size,int *width,int *height,uint8_t **u,
                       uint8_t **v,int *stride,int *uv_stride)

{
  uint8_t *puVar1;
  WebPDecBuffer WStack_88;
  
  puVar1 = Decode(MODE_YUV,data,data_size,width,height,&WStack_88);
  if (puVar1 != (uint8_t *)0x0) {
    *u = WStack_88.u.YUVA.u;
    *v = (uint8_t *)WStack_88.u.RGBA.size;
    *stride = WStack_88.u.YUVA.y_stride;
    *uv_stride = WStack_88.u.YUVA.u_stride;
  }
  return puVar1;
}

Assistant:

uint8_t* WebPDecodeYUV(const uint8_t* data, size_t data_size,
                       int* width, int* height, uint8_t** u, uint8_t** v,
                       int* stride, int* uv_stride) {
  WebPDecBuffer output;   // only to preserve the side-infos
  uint8_t* const out = Decode(MODE_YUV, data, data_size,
                              width, height, &output);

  if (out != NULL) {
    const WebPYUVABuffer* const buf = &output.u.YUVA;
    *u = buf->u;
    *v = buf->v;
    *stride = buf->y_stride;
    *uv_stride = buf->u_stride;
    assert(buf->u_stride == buf->v_stride);
  }
  return out;
}